

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlignDefault_CeilDefaultAligned_Test::TestBody
          (ArenaAlignDefault_CeilDefaultAligned_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  AssertHelper local_3b8;
  Message local_3b0 [6];
  exception *gtest_exception_4;
  ReturnSentinel gtest_sentinel_4;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_4;
  pointer local_358;
  DeathTest *gtest_dt_4;
  Message local_348 [6];
  exception *gtest_exception_3;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_2f0;
  DeathTest *gtest_dt_3;
  Message local_2e0 [6];
  exception *gtest_exception_2;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_288;
  DeathTest *gtest_dt_2;
  Message local_278 [6];
  exception *gtest_exception_1;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_220;
  DeathTest *gtest_dt_1;
  Message local_210;
  int local_204;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_1b0;
  DeathTest *gtest_dt;
  Message local_1a0;
  char *local_198;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_190;
  EqMatcher<char_*> local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_2;
  Message local_168;
  char *local_160;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_158;
  EqMatcher<char_*> local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  Message local_120;
  char *local_118;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_110;
  EqMatcher<char_*> local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  char local_e8;
  undefined1 auStack_e7 [6];
  ArenaAlignDefault align_default;
  char p [17];
  ArenaAlignDefault_CeilDefaultAligned_Test *this_local;
  char *local_c0;
  char *local_b8;
  anon_class_1_0_00000001 local_a9;
  char *local_a8;
  char *local_a0;
  anon_class_1_0_00000001 local_91;
  char *local_90;
  char *local_88;
  anon_class_1_0_00000001 local_79;
  ArenaAlignDefault *local_78;
  ArenaAlignDefault *local_70;
  anon_class_1_0_00000001 local_61;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_48;
  char *local_40;
  char *local_30;
  char *local_28;
  char *local_18;
  char *local_10;
  
  unique0x10001121 = this;
  memset(&local_e8,0,0x11);
  memset((void *)((long)&gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 7),0,1);
  local_110.rhs_ = (char *)testing::Eq<char*>(&local_e8);
  local_108.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_110.rhs_);
  local_118 = &local_e8;
  local_18 = local_118;
  local_10 = local_118;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_100,(char *)&local_108,(char **)"align_default.CeilDefaultAligned(p + 0)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_158.rhs_ = (char *)testing::Eq<char*>(p);
  local_150.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_158.rhs_);
  local_160 = p;
  local_30 = local_160;
  local_28 = local_160;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_148,(char *)&local_150,(char **)"align_default.CeilDefaultAligned(p + 8)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x58,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_190.rhs_ = (char *)testing::Eq<char*>(p + 8);
  local_188.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_190.rhs_);
  local_198 = p + 8;
  local_48 = local_198;
  local_40 = local_198;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_180,(char *)&local_188,(char **)"align_default.CeilDefaultAligned(p + 16)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)0x212dcbb,regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 1)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5b,&local_1b0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_004b22bb;
    if (local_1b0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_1b0);
      iVar2 = (*local_1b0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1b0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1b0->_vptr_DeathTest[4])(local_1b0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_004b227d;
        local_204 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_1b0);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (local_60 = auStack_e7, local_58 = local_60, ((ulong)local_60 & 7) != 0)) {
            ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                      (&local_61);
          }
          (*local_1b0->_vptr_DeathTest[5])(local_1b0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_004b227d:
        local_204 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_204 != 0) goto LAB_004b22bb;
    }
  }
  else {
LAB_004b22bb:
    testing::Message::Message(&local_210);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_210);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)0x212dcbb,regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 7)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5c,&local_220);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_004b273e;
    if (local_220 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_220);
      iVar2 = (*local_220->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_220->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_220->_vptr_DeathTest[4])(local_220,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_004b2700;
        local_204 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1,local_220);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) &&
             (local_78 = &align_default, local_70 = local_78, ((ulong)local_78 & 7) != 0)) {
            ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                      (&local_79);
          }
          (*local_220->_vptr_DeathTest[5])(local_220,2);
          local_204 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1);
        }
LAB_004b2700:
        local_204 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_204 != 0) goto LAB_004b273e;
    }
  }
  else {
LAB_004b273e:
    testing::Message::Message(local_278);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_278);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)0x212dcbb,regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 9)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5d,&local_288);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_004b2bca;
    if (local_288 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_288);
      iVar2 = (*local_288->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_288->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_288->_vptr_DeathTest[4])(local_288,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_004b2b8c;
        local_204 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_2,local_288);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (local_90 = p + 1, local_88 = local_90, ((ulong)local_90 & 7) != 0)) {
            ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                      (&local_91);
          }
          (*local_288->_vptr_DeathTest[5])(local_288,2);
          local_204 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_2);
        }
LAB_004b2b8c:
        local_204 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_204 != 0) goto LAB_004b2bca;
    }
  }
  else {
LAB_004b2bca:
    testing::Message::Message(local_2e0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(local_2e0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)0x212dcbb,regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 15)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5e,&local_2f0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_004b305c;
    if (local_2f0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_2f0);
      iVar2 = (*local_2f0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_2f0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_2f0->_vptr_DeathTest[4])(local_2f0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_004b301e;
        local_204 = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_3,local_2f0);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (local_a8 = p + 7, local_a0 = local_a8, ((ulong)local_a8 & 7) != 0)) {
            ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                      (&local_a9);
          }
          (*local_2f0->_vptr_DeathTest[5])(local_2f0,2);
          local_204 = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_3);
        }
LAB_004b301e:
        local_204 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_204 != 0) goto LAB_004b305c;
    }
  }
  else {
LAB_004b305c:
    testing::Message::Message(local_348);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_4,local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_4);
    testing::Message::~Message(local_348);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_004b34ee;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&gtest_dt_ptr_4,(internal *)0x212dcbb,regex_03);
  bVar1 = testing::internal::DeathTest::Create
                    ("align_default.CeilDefaultAligned(p + 17)",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&gtest_dt_ptr_4,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                     ,0x5f,&local_358);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)&gtest_dt_ptr_4);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_004b34ee;
  if (local_358 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel_4,local_358);
  iVar2 = (*local_358->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_358->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_358->_vptr_DeathTest[4])(local_358,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_004b34b0;
    local_204 = 10;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                ((ReturnSentinel *)&gtest_exception_4,local_358);
      bVar1 = testing::internal::AlwaysTrue();
      if ((bVar1) && (local_c0 = p + 9, local_b8 = local_c0, ((ulong)local_c0 & 7) != 0)) {
        ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&this_local + 7));
      }
      (*local_358->_vptr_DeathTest[5])(local_358,2);
      local_204 = 0xb;
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                ((ReturnSentinel *)&gtest_exception_4);
    }
LAB_004b34b0:
    local_204 = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel_4);
  if (local_204 == 0) {
    return;
  }
LAB_004b34ee:
  testing::Message::Message(local_3b0);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
             ,0x5f,pcVar4);
  testing::internal::AssertHelper::operator=(&local_3b8,local_3b0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b8);
  testing::Message::~Message(local_3b0);
  return;
}

Assistant:

TEST(ArenaAlignDefault, CeilDefaultAligned) {
  alignas(8) char p[17] = {0};
  auto align_default = ArenaAlignDefault();
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 0), Eq(p + 0));
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 8), Eq(p + 8));
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 16), Eq(p + 16));
#if GTEST_HAS_DEATH_TEST
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 1), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 7), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 9), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 15), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 17), ".*");
#endif  // GTEST_HAS_DEATH_TEST
}